

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmGeneratorTarget *t;
  bool bVar1;
  mapped_type *deps;
  pointer ppcVar2;
  cmGeneratorTarget *target;
  cmComputeTargetDepends ctd;
  cmGeneratorTarget *local_120;
  cmComputeTargetDepends local_118;
  
  cmComputeTargetDepends::cmComputeTargetDepends(&local_118,this);
  bVar1 = cmComputeTargetDepends::Compute(&local_118);
  if (bVar1) {
    for (ppcVar2 = local_118.Targets.
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppcVar2 !=
        local_118.Targets.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
      t = *ppcVar2;
      local_120 = t;
      deps = std::
             map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,&local_120);
      cmComputeTargetDepends::GetTargetDirectDepends(&local_118,t,deps);
    }
  }
  cmComputeTargetDepends::~cmComputeTargetDepends(&local_118);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if (!ctd.Compute()) {
    return false;
  }
  for (cmGeneratorTarget const* target : ctd.GetTargets()) {
    ctd.GetTargetDirectDepends(target, this->TargetDependencies[target]);
  }
  return true;
}